

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCreateTarget(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,Vec_Int_t *vValues)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_54;
  int i;
  Abc_Obj_t *pNodePo;
  Abc_Obj_t *pOther;
  Abc_Obj_t *pFinal;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vValues_local;
  Vec_Ptr_t *vRoots_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x480,"Abc_Ntk_t *Abc_NtkCreateTarget(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  Abc_NtkCleanCopy(pNtk);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar2 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar2;
  p = Abc_NtkDfsNodes(pNtk,(Abc_Obj_t **)vRoots->pArray,vRoots->nSize);
  for (local_54 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_54 < iVar1; local_54 = local_54 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_54);
    pAVar4 = Abc_NtkCreatePi(pNtk_00);
    (pAVar3->field_6).pCopy = pAVar4;
    pAVar4 = (pAVar3->field_6).pCopy;
    pcVar2 = Abc_ObjName(pAVar3);
    Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
  }
  for (local_54 = 0; iVar1 = Vec_PtrSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,local_54);
    pAVar3 = Abc_NodeStrash(pNtk_00,pAVar4,0);
    (pAVar4->field_6).pCopy = pAVar3;
  }
  Vec_PtrFree(p);
  pOther = Abc_AigConst1(pNtk_00);
  for (local_54 = 0; iVar1 = Vec_PtrSize(vRoots), local_54 < iVar1; local_54 = local_54 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vRoots,local_54);
    iVar1 = Abc_ObjIsCo(pAVar4);
    if (iVar1 == 0) {
      pNodePo = (pAVar4->field_6).pCopy;
    }
    else {
      pAVar4 = Abc_ObjFanin0(pAVar4);
      pNodePo = (pAVar4->field_6).pCopy;
    }
    iVar1 = Vec_IntEntry(vValues,local_54);
    if (iVar1 == 0) {
      pNodePo = Abc_ObjNot(pNodePo);
    }
    pOther = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pOther,pNodePo);
  }
  pAVar4 = Abc_NtkCreatePo(pNtk_00);
  Abc_ObjAddFanin(pAVar4,pOther);
  Abc_ObjAssignName(pAVar4,"miter",(char *)0x0);
  iVar1 = Abc_NtkCheck(pNtk_00);
  if (iVar1 == 0) {
    fprintf(_stdout,"Abc_NtkCreateTarget(): Network check has failed.\n");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateTarget( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, Vec_Int_t * vValues )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFinal, * pOther, * pNodePo;
    int i;

    assert( Abc_NtkIsLogic(pNtk) );
    
    // start the network
    Abc_NtkCleanCopy( pNtk );
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);

    // collect the nodes in the TFI of the output
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)vRoots->pArray, vRoots->nSize );
    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = Abc_NodeStrash( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );

    // add the PO
    pFinal = Abc_AigConst1( pNtkNew );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
    {
        if ( Abc_ObjIsCo(pObj) )
            pOther = Abc_ObjFanin0(pObj)->pCopy;
        else
            pOther = pObj->pCopy;
        if ( Vec_IntEntry(vValues, i) == 0 )
            pOther = Abc_ObjNot(pOther);
        pFinal = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pFinal, pOther );
    }

    // add the PO corresponding to this output
    pNodePo = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAddFanin( pNodePo, pFinal );
    Abc_ObjAssignName( pNodePo, "miter", NULL );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateTarget(): Network check has failed.\n" );
    return pNtkNew;
}